

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  String *pSVar1;
  String *pSVar2;
  undefined8 *puVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  String str;
  Fault f;
  String local_48;
  String local_30;
  
  pcVar6 = part.ptr;
  if (pcVar6 != (char *)0x0) {
    if (pcVar6 == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        if ((String *)(this->parts).size_ == (this->parts).ptr) {
          evalPart();
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((pcVar6 == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString(&str,(char *)parts,(size_t)pcVar6);
    sVar7 = str.content.size_;
    pcVar6 = (char *)str.content.size_;
    if (str.content.size_ != 0) {
      pcVar6 = str.content.ptr;
    }
    sVar4 = strlen(pcVar6);
    sVar5 = 0;
    if (sVar7 != 0) {
      sVar5 = sVar7 - 1;
    }
    if (sVar4 != sVar5) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::String&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x142,FAILED,"strlen(str.begin()) == str.size()",
                 "\"NUL character in path component\", str",
                 (char (*) [32])"NUL character in path component",&str);
      local_30.content.ptr = str.content.ptr;
      local_30.content.size_ = str.content.size_;
      local_30.content.disposer = str.content.disposer;
      str.content.ptr = (char *)0x0;
      str.content.size_ = 0;
      stripNul(&local_48,&local_30);
      sVar7 = str.content.size_;
      pcVar6 = str.content.ptr;
      if (str.content.ptr != (char *)0x0) {
        str.content.ptr = (char *)0x0;
        str.content.size_ = 0;
        (**(str.content.disposer)->_vptr_ArrayDisposer)(str.content.disposer,pcVar6,1,sVar7,sVar7,0)
        ;
      }
      str.content.ptr = local_48.content.ptr;
      str.content.size_ = local_48.content.size_;
      str.content.disposer = local_48.content.disposer;
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      String::~String(&local_48);
      String::~String(&local_30);
      _::Debug::Fault::~Fault(&f);
    }
    pSVar1 = (String *)(this->parts).disposer;
    if ((String *)(this->parts).size_ == pSVar1) {
      pSVar2 = (this->parts).ptr;
      sVar7 = 4;
      if (pSVar1 != pSVar2) {
        sVar7 = ((long)pSVar1 - (long)pSVar2 >> 3) * 0x5555555555555556;
      }
      Vector<kj::String>::setCapacity((Vector<kj::String> *)this,sVar7);
    }
    puVar3 = (undefined8 *)(this->parts).size_;
    *puVar3 = str.content.ptr;
    puVar3[1] = str.content.size_;
    puVar3[2] = str.content.disposer;
    (this->parts).size_ = (size_t)(puVar3 + 3);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}